

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::WriteAccelerationStructuresProperties
          (VulkanCommandBuffer *this,VkAccelerationStructureKHR accelerationStructure,
          VkQueryType queryType,VkQueryPool queryPool,uint32_t firstQuery)

{
  VkAccelerationStructureKHR accelerationStructure_local;
  string msg;
  
  accelerationStructure_local = accelerationStructure;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])queryPool);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"WriteAccelerationStructuresProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,700);
    std::__cxx11::string::~string((string *)&msg);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdWriteAccelerationStructuresPropertiesKHR)
            (this->m_VkCmdBuffer,1,&accelerationStructure_local,queryType,queryPool,firstQuery);
  return;
}

Assistant:

__forceinline void WriteAccelerationStructuresProperties(VkAccelerationStructureKHR accelerationStructure, VkQueryType queryType, VkQueryPool queryPool, uint32_t firstQuery)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Write AS properties operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdWriteAccelerationStructuresPropertiesKHR(m_VkCmdBuffer, 1, &accelerationStructure, queryType, queryPool, firstQuery);
#else
        UNSUPPORTED("Ray tracing is not supported when vulkan library is linked statically");
#endif
    }